

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O1

lzma_vli lzma_index_size(lzma_index *i)

{
  lzma_vli lVar1;
  uint32_t uVar2;
  long lVar3;
  
  lVar1 = i->index_list_size;
  uVar2 = lzma_vli_size(i->record_count);
  lVar3 = (uVar2 + 1) + lVar1;
  if (-1 < lVar3 + 4) {
    return lVar3 + 7U & 0xfffffffffffffffc;
  }
  __assert_fail("vli <= LZMA_VLI_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/common/index.h"
                ,0x29,"lzma_vli vli_ceil4(lzma_vli)");
}

Assistant:

extern LZMA_API(lzma_vli)
lzma_index_size(const lzma_index *i)
{
	return index_size(i->record_count, i->index_list_size);
}